

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_hv_accept.cpp
# Opt level: O2

int __thiscall
ir_emit_vertex::accept(ir_emit_vertex *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  int iVar2;
  undefined4 in_register_00000034;
  long *plVar3;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (**(code **)(*plVar3 + 0x120))(plVar3,this);
  if (iVar1 == 0) {
    iVar1 = (*(this->stream->super_ir_instruction)._vptr_ir_instruction[3])(this->stream,plVar3);
    if (iVar1 == 0) {
      iVar1 = (**(code **)(*plVar3 + 0x128))(plVar3,this);
      return iVar1;
    }
  }
  iVar2 = 0;
  if (iVar1 != 1) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

ir_visitor_status
ir_emit_vertex::accept(ir_hierarchical_visitor *v)
{
   ir_visitor_status s = v->visit_enter(this);
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   s = this->stream->accept(v);
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   assert(s == visit_continue);
   return v->visit_leave(this);
}